

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void TPZReducedSpace::SetAllCreateFunctionsReducedSpace(TPZCompMesh *cmesh)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *this;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *__f;
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> *this_00;
  TPZCreateApproximationSpace *this_01;
  TPZCreateApproximationSpace *createfuncs;
  TPZCompMesh *in_RDI;
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> functions;
  _func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *in_stack_fffffffffffffe58;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffea8;
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> *in_stack_fffffffffffffeb0
  ;
  
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10>::TPZManVector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
            ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
             &stack0xfffffffffffffe98,0);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
            ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
             &stack0xfffffffffffffe98,1);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
            ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
             &stack0xfffffffffffffe98,3);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  this = TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
                   ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
                    &stack0xfffffffffffffe98,2);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=(this,in_stack_fffffffffffffe58);
  __f = TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
                  ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
                   &stack0xfffffffffffffe98,6);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this,(_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)__f);
  this_00 = (TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> *)
            TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
                      ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
                       &stack0xfffffffffffffe98,4);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this,(_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)__f);
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
            ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
             &stack0xfffffffffffffe98,5);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this,(_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)__f);
  this_01 = (TPZCreateApproximationSpace *)
            TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::operator[]
                      ((TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)
                       &stack0xfffffffffffffe98,7);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this,(_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)__f);
  createfuncs = TPZCompMesh::ApproxSpace(in_RDI);
  TPZCreateApproximationSpace::SetCreateFunctions
            (this_01,(TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *)createfuncs);
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10>::~TPZManVector(this_00);
  return;
}

Assistant:

void TPZReducedSpace::SetAllCreateFunctionsReducedSpace(TPZCompMesh *cmesh)
{
    TPZManVector<TCreateFunction,10> functions(8);
    functions[EPoint] = CreateReducedElement;
	functions[EOned] = CreateReducedElement;
	functions[EQuadrilateral] = CreateReducedElement;
	functions[ETriangle] = CreateReducedElement;
	functions[EPrisma] = CreateReducedElement;
	functions[ETetraedro] = CreateReducedElement;
	functions[EPiramide] = CreateReducedElement;
	functions[ECube] = CreateReducedElement;
    cmesh->ApproxSpace().SetCreateFunctions(functions);
}